

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_XO.cpp
# Opt level: O3

void example::learning_XO(void)

{
  longdouble **pplVar1;
  longdouble *plVar2;
  longdouble *plVar3;
  longdouble *plVar4;
  longdouble *plVar5;
  longdouble lVar6;
  undefined1 acceptableError [16];
  undefined1 learningRate [16];
  undefined1 adaptiveLearningRate [16];
  tensor ppplVar7;
  tensor ppplVar8;
  tensor ppplVar9;
  ostream *poVar10;
  Convolution2D *pCVar11;
  FullyConnected *this;
  Loss *this_00;
  int x;
  uint uVar12;
  longdouble **pplVar13;
  char *__to;
  int iVar14;
  int iVar15;
  int y;
  int iVar16;
  long lVar17;
  Layer *layer;
  int iVar18;
  uint uVar19;
  long lVar20;
  int y_1;
  tensor in [2];
  SequentialModule module;
  tensor out [2];
  undefined2 in_stack_ffffffffffffff22;
  undefined4 in_stack_ffffffffffffff24;
  undefined6 in_stack_ffffffffffffff32;
  char local_b9;
  tensor local_b8;
  tensor local_b0;
  SequentialModule local_a8;
  tensor local_38;
  tensor local_30;
  
  ppplVar7 = type::createTensor(8,8,1);
  local_b8 = ppplVar7;
  ppplVar8 = type::createTensor(8,8,1);
  local_b0 = ppplVar8;
  ppplVar9 = type::createTensor(2,1,1);
  local_38 = ppplVar9;
  local_30 = type::createTensor(2,1,1);
  pplVar1 = *ppplVar7;
  pplVar13 = pplVar1 + 7;
  lVar17 = 0;
  lVar6 = (longdouble)1;
  do {
    *(longdouble *)(*(long *)((long)pplVar1 + lVar17) + lVar17 * 2) = lVar6;
    *(longdouble *)((long)*pplVar13 + lVar17 * 2) = lVar6;
    pplVar13 = pplVar13 + -1;
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x40);
  plVar2 = **ppplVar9;
  *plVar2 = lVar6;
  plVar2[1] = (longdouble)0;
  pplVar13 = *ppplVar8;
  uVar12 = 0;
  iVar16 = 3;
  iVar18 = 2;
  do {
    lVar17 = (long)(int)uVar12 + 4;
    plVar2 = pplVar13[(long)(int)uVar12 + 4];
    lVar20 = (long)iVar16 + 4;
    plVar2[lVar20] = lVar6;
    plVar3 = pplVar13[(long)iVar16 + 4];
    plVar3[lVar17] = lVar6;
    iVar15 = 4 - uVar12;
    plVar4 = pplVar13[iVar15];
    plVar4[lVar20] = lVar6;
    iVar14 = 4 - iVar16;
    plVar5 = pplVar13[iVar14];
    plVar5[lVar17] = lVar6;
    plVar2[iVar14] = lVar6;
    plVar3[iVar15] = lVar6;
    plVar4[iVar14] = lVar6;
    plVar5[iVar15] = lVar6;
    if (SBORROW4(iVar18,uVar12 * 2) == (int)(iVar18 + uVar12 * -2) < 0) {
      uVar19 = ~(uVar12 * 2);
LAB_00104e86:
      uVar12 = uVar12 + 1;
    }
    else {
      if (iVar16 * -2 + 6 <= iVar18) {
        uVar19 = (~uVar12 + iVar16) * 2;
        iVar16 = iVar16 + -1;
        goto LAB_00104e86;
      }
      uVar19 = iVar16 * 2 - 1;
      iVar16 = iVar16 + -1;
    }
    iVar18 = iVar18 + uVar19;
    if (iVar16 < (int)uVar12) {
      plVar2 = **local_30;
      *plVar2 = (longdouble)0;
      plVar2[1] = lVar6;
      lVar17 = 0;
      do {
        lVar20 = 0;
        do {
          poVar10 = std::ostream::_M_insert<long_double>
                              (*(longdouble *)((long)(*local_b8)[lVar17] + lVar20));
          local_a8._vptr_SequentialModule._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_a8,1);
          lVar20 = lVar20 + 0x10;
        } while (lVar20 != 0x80);
        local_a8._vptr_SequentialModule._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_a8,1);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 8);
      local_a8._vptr_SequentialModule._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_a8,1);
      local_a8._vptr_SequentialModule._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_a8,1);
      lVar17 = 0;
      do {
        lVar20 = 0;
        do {
          poVar10 = std::ostream::_M_insert<long_double>
                              (*(longdouble *)((long)(*local_b0)[lVar17] + lVar20));
          local_a8._vptr_SequentialModule._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_a8,1);
          lVar20 = lVar20 + 0x10;
        } while (lVar20 != 0x80);
        local_a8._vptr_SequentialModule._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_a8,1);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 8);
      ::module::SequentialModule::SequentialModule(&local_a8);
      acceptableError._10_2_ = in_stack_ffffffffffffff22;
      acceptableError._0_10_ = (longdouble)0.001;
      acceptableError._12_4_ = in_stack_ffffffffffffff24;
      ::module::SequentialModule::setStopParameter(&local_a8,500,(scalar)acceptableError);
      learningRate._10_2_ = in_stack_ffffffffffffff22;
      learningRate._0_10_ = (longdouble)0.2;
      learningRate._12_4_ = in_stack_ffffffffffffff24;
      adaptiveLearningRate._10_6_ = in_stack_ffffffffffffff32;
      adaptiveLearningRate._0_10_ = (longdouble)1e-10;
      ::module::SequentialModule::setTrainingParameter
                (&local_a8,(scalar)learningRate,(scalar)adaptiveLearningRate);
      ::module::SequentialModule::setInput(&local_a8,8,8,1);
      pCVar11 = (Convolution2D *)operator_new(0x88);
      ::layer::Convolution2D::Convolution2D(pCVar11,2,3,3,2,0,0,1,1);
      ::module::SequentialModule::add(&local_a8,(Layer *)pCVar11);
      pCVar11 = (Convolution2D *)operator_new(0x88);
      ::layer::Convolution2D::Convolution2D(pCVar11,2,3,3,2,0,0,1,1);
      ::module::SequentialModule::add(&local_a8,(Layer *)pCVar11);
      this = (FullyConnected *)operator_new(0x78);
      ::layer::FullyConnected::FullyConnected(this,8,2,true);
      ::module::SequentialModule::add(&local_a8,(Layer *)this);
      this_00 = (Loss *)operator_new(0x88);
      ::layer::Loss::Loss(this_00,2,2,2,true);
      layer = (Layer *)((long)&this_00->_vptr_Loss + (long)this_00->_vptr_Loss[-3]);
      ::module::SequentialModule::add(&local_a8,layer);
      ::module::SequentialModule::link(&local_a8,(char *)layer,__to);
      local_b9 = 'a';
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,&local_b9,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      ::module::SequentialModule::training(&local_a8,&local_b8,&local_38,2,1.0);
      local_b9 = 'b';
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,&local_b9,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Resulta: ",0xb);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      ::module::SequentialModule::predict(&local_a8,local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  X : ",6);
      ppplVar7 = ::layer::Layer::getPtrOut
                           (local_a8._lLayers.
                            super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1]);
      poVar10 = std::ostream::_M_insert<long_double>(***ppplVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      ppplVar7 = ::layer::Layer::getPtrOut
                           (local_a8._lLayers.
                            super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1]);
      poVar10 = std::ostream::_M_insert<long_double>((**ppplVar7)[1]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      ::module::SequentialModule::predict(&local_a8,local_b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  O : ",6);
      ppplVar7 = ::layer::Layer::getPtrOut
                           (local_a8._lLayers.
                            super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1]);
      poVar10 = std::ostream::_M_insert<long_double>(***ppplVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      ppplVar7 = ::layer::Layer::getPtrOut
                           (local_a8._lLayers.
                            super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1]);
      poVar10 = std::ostream::_M_insert<long_double>((**ppplVar7)[1]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      ::module::SequentialModule::~SequentialModule(&local_a8);
      return;
    }
  } while( true );
}

Assistant:

void learning_XO()
    {
        type::tensor in[2];
        in[0] = type::createTensor(8, 8, 1);
        in[1] = type::createTensor(8, 8, 1);

        type::tensor out[2];
        out[0] = type::createTensor(2, 1, 1);
        out[1] = type::createTensor(2, 1, 1);

        for(int i(0); i < 8; i++){
            (*in[0])[i][i] = 1;
            (*in[0])[7 - i][i] = 1;
        }
        (**out[0])[0] = 1;
        (**out[0])[1] = 0;

        {
            int x = 0;
            int y = 3;
            int d = 3 - 1;
            while (y >= x)
            {
                (*in[1])[4 + x][4 + y] = 1;
                (*in[1])[4 + y][4 + x] = 1;
                (*in[1])[4 - x][4 + y] = 1;
                (*in[1])[4 - y][4 + x] = 1;
                (*in[1])[4 + x][4 - y] = 1;
                (*in[1])[4 + y][4 - x] = 1;
                (*in[1])[4 - x][4 - y] = 1;
                (*in[1])[4 - y][4 - x] = 1;

                if (d >= 2 * x)
                {
                    d -= 2 * x + 1;
                    x++;
                }
                else if (d < 2 * (3 - y))
                {
                    d += 2 * y - 1;
                    y--;
                }
                else
                {
                    d += 2 * (y - x - 1);
                    y--;
                    x++;
                }
            }
        }
        (**out[1])[0] = 0;
        (**out[1])[1] = 1;

        for(int y(0); y < 8; y++) {
            for(int x(0); x < 8; x++) {
                std::cout << (*in[0])[y][x] << ' ';
            }
            std::cout << '\n';
        }
        std::cout << '\n';
        std::cout << '\n';

        for(int y(0); y < 8; y++) {
            for(int x(0); x < 8; x++) {
                std::cout << (*in[1])[y][x] << ' ';
            }
            std::cout << '\n';
        }

        function::tool::initParamRandTool(-0.1, 0.1);
        function::tool::initRandTool(486446);
        module::SequentialModule module;
        module.setStopParameter(500, 0.001);
        module.setTrainingParameter(0.2, 0.0000000001);
        module.setInput(8, 8, 1);
        module.add(new layer::Convolution2D(2, 3, 3, ACTIVATION_SIGMOIDE, 0, 0, 1, 1));
        module.add(new layer::Convolution2D(2, 3, 3, ACTIVATION_SIGMOIDE, 0, 0, 1, 1));
        module.add(new layer::FullyConnected(8, ACTIVATION_SIGMOIDE, true));
        module.add(new layer::Loss(2, ACTIVATION_SIGMOIDE, LOSS_LOGLOSS, true));
        module.link();

        std::cout << 'a' << std::endl;
        module.training(in, out, 2, 1);
        std::cout << 'b' << std::endl;

        std::cout << "- Resulta: " << std::endl;
        module.predict(in[0]);
        std::cout << "  X : " << (**module.getOut())[0] << ", " << (**module.getOut())[1] << std::endl;
        module.predict(in[1]);
        std::cout << "  O : " << (**module.getOut())[0] << ", " << (**module.getOut())[1] << std::endl;



    }